

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O1

void __thiscall spdlog::details::registry::flush_every(registry *this,seconds interval)

{
  int iVar1;
  periodic_worker *this_00;
  pointer __p;
  function<void_()> clbk;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  __uniq_ptr_impl<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
  local_28;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->flusher_mutex_);
  if (iVar1 == 0) {
    local_38 = (code *)0x0;
    pcStack_30 = (code *)0x0;
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_48._M_unused._M_object = operator_new(0x18);
    *(code **)local_48._M_unused._0_8_ = flush_all;
    *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
    *(registry **)((long)local_48._M_unused._0_8_ + 0x10) = this;
    pcStack_30 = std::
                 _Function_handler<void_(),_std::_Bind<void_(spdlog::details::registry::*(spdlog::details::registry_*))()>_>
                 ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(),_std::_Bind<void_(spdlog::details::registry::*(spdlog::details::registry_*))()>_>
               ::_M_manager;
    this_00 = (periodic_worker *)operator_new(0x68);
    periodic_worker::periodic_worker(this_00,(function<void_()> *)&local_48,interval);
    local_28._M_t.
    super__Tuple_impl<0UL,_spdlog::details::periodic_worker_*,_std::default_delete<spdlog::details::periodic_worker>_>
    .super__Head_base<0UL,_spdlog::details::periodic_worker_*,_false>._M_head_impl =
         (tuple<spdlog::details::periodic_worker_*,_std::default_delete<spdlog::details::periodic_worker>_>
          )(_Tuple_impl<0UL,_spdlog::details::periodic_worker_*,_std::default_delete<spdlog::details::periodic_worker>_>
            )0x0;
    std::
    __uniq_ptr_impl<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
    ::reset((__uniq_ptr_impl<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
             *)&this->periodic_flusher_,this_00);
    std::
    unique_ptr<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
    ::~unique_ptr((unique_ptr<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
                   *)&local_28);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->flusher_mutex_);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

SPDLOG_INLINE void registry::flush_every(std::chrono::seconds interval)
{
    std::lock_guard<std::mutex> lock(flusher_mutex_);
    std::function<void()> clbk = std::bind(&registry::flush_all, this);
    periodic_flusher_ = details::make_unique<periodic_worker>(clbk, interval);
}